

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Session::~Session(Session *this)

{
  Session *this_local;
  
  cleanUp();
  Ptr<Catch::Config>::~Ptr(&this->m_config);
  ConfigData::~ConfigData(&this->m_configData);
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::~vector
            (&this->m_unusedTokens);
  Clara::CommandLine<Catch::ConfigData>::~CommandLine(&this->m_cli);
  return;
}

Assistant:

~Session() {
            Catch::cleanUp();
        }